

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<unsigned_int,_int>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<unsigned_int,_int> *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  int iVar5;
  bool bVar6;
  unsigned_long uVar7;
  ulong uVar8;
  uint value;
  bool bVar9;
  byte bVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  
  bVar9 = true;
  if (this->compression_buffer_idx != 0) {
    if (((this->all_invalid == false) && (this->maximum != this->minimum)) ||
       (1 < (byte)(this->mode - AUTO))) {
      bVar6 = TrySubtractOperator::Operation<unsigned_int,unsigned_int,unsigned_int>
                        (this->maximum,this->minimum,&this->min_max_diff);
      this->can_do_for = bVar6;
      CalculateDeltaStats(this);
      if (this->can_do_delta == true) {
        iVar1 = this->minimum_delta;
        if ((this->maximum_delta == iVar1) && ((this->mode & ~AUTO) != DELTA_FOR)) {
          this->total_size = this->total_size + 0xc;
          return true;
        }
        uVar2 = this->min_max_diff;
        uVar3 = this->min_max_delta_diff;
        iVar5 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        bVar11 = 0x20 - ((byte)iVar5 ^ 0x1f);
        if (0xfffffff < uVar3) {
          bVar11 = 0x20;
        }
        if (uVar3 == 0) {
          bVar11 = 0;
        }
        iVar5 = 0x1f;
        if (uVar2 != 0) {
          for (; uVar2 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        bVar10 = 0x20 - ((byte)iVar5 ^ 0x1f);
        if (0xfffffff < uVar2) {
          bVar10 = 0x20;
        }
        bVar6 = this->mode != FOR;
        if ((bVar6 && uVar2 != 0) && bVar11 < bVar10) {
          uVar12 = this->compression_buffer_idx;
          if (uVar12 != 0) {
            uVar8 = 0;
            do {
              this->delta_buffer[uVar8] = this->delta_buffer[uVar8] - iVar1;
              uVar8 = uVar8 + 1;
            } while (uVar12 != uVar8);
          }
          this->total_size = this->total_size + 0x10;
          if ((uVar12 & 0x1f) != 0) {
            uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar12 & 0x1f);
            uVar12 = (uVar12 - uVar7) + 0x20;
          }
          this->total_size = this->total_size + (bVar11 * uVar12 >> 3);
          if ((bVar6 && uVar2 != 0) && bVar11 < bVar10) {
            return true;
          }
        }
      }
      if (this->can_do_for == true) {
        uVar2 = this->min_max_diff;
        uVar3 = 0x1f;
        if (uVar2 != 0) {
          for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar13 = 0x20;
        if (uVar2 < 0x10000000) {
          uVar13 = (uVar3 ^ 0xffffffe0) + 0x21;
        }
        uVar12 = this->compression_buffer_idx;
        if (uVar12 != 0) {
          puVar4 = this->compression_buffer;
          uVar3 = this->minimum;
          uVar8 = 0;
          do {
            puVar4[uVar8] = puVar4[uVar8] - uVar3;
            uVar8 = uVar8 + 1;
          } while (uVar12 != uVar8);
        }
        if ((uVar12 & 0x1f) != 0) {
          uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar12 & 0x1f);
          uVar12 = (uVar12 - uVar7) + 0x20;
        }
        if (uVar2 == 0) {
          uVar13 = 0;
        }
        this->total_size = this->total_size + (uVar13 * uVar12 >> 3) + 0xc;
      }
      else {
        bVar9 = false;
      }
    }
    else {
      this->total_size = this->total_size + 8;
    }
  }
  return bVar9;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}